

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3GenerateConstraintChecks
               (Parse *pParse,Table *pTab,int *aRegIdx,int iDataCur,int iIdxCur,int regNewData,
               int regOldData,u8 pkChng,u8 overrideError,int ignoreDest,int *pbMayReplace,
               int *aiChng,Upsert *pUpsert)

{
  short sVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  sqlite3 *db_00;
  ExprList *pEVar6;
  Expr *pExpr_00;
  bool bVar7;
  i16 iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Vdbe *p;
  char *pP4;
  Trigger *pTVar12;
  FKey *pFVar13;
  CollSeq *zP4;
  int op_00;
  bool bVar14;
  int local_130;
  int local_12c;
  uint local_11c;
  Trigger *local_110;
  Trigger *pTrigger_1;
  char *p4;
  int regCmp;
  int op;
  int addrJump;
  int x_1;
  int x;
  int iField;
  int addrUniqueOk;
  int iThisCur;
  int regR;
  int regIdx;
  Trigger *pTrigger;
  char *pcStack_c8;
  int addrRowidOk;
  char *zName;
  Expr *pExpr;
  int allOk;
  ExprList *pCheck;
  char *zMsg;
  int local_98;
  int ipkBottom;
  int ipkTop;
  int upsertJump;
  int upsertBypass;
  u8 bAffinityDone;
  u8 isUpdate;
  Index *pUpIdx;
  int local_78;
  int nPkField;
  int seenReplace;
  int addr1;
  int onError;
  int nCol;
  int ix;
  int i;
  sqlite3 *db;
  Index *pPk;
  Index *pIdx;
  Vdbe *v;
  int regNewData_local;
  int iIdxCur_local;
  int iDataCur_local;
  int *aRegIdx_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  local_78 = 0;
  _upsertBypass = (Index *)0x0;
  bVar7 = false;
  ipkTop = 0;
  ipkBottom = 0;
  local_98 = 0;
  zMsg._4_4_ = 0;
  bVar14 = regOldData != 0;
  db_00 = pParse->db;
  p = sqlite3GetVdbe(pParse);
  sVar1 = pTab->nCol;
  if ((pTab->tabFlags & 0x20) == 0) {
    db = (sqlite3 *)0x0;
    pUpIdx._4_4_ = 1;
  }
  else {
    db = (sqlite3 *)sqlite3PrimaryKeyIndex(pTab);
    pUpIdx._4_4_ = (uint)*(ushort *)&db->enc;
  }
  for (nCol = 0; nCol < sVar1; nCol = nCol + 1) {
    if ((nCol != pTab->iPKey) &&
       (((aiChng == (int *)0x0 || (-1 < aiChng[nCol])) &&
        (seenReplace = (int)pTab->aCol[nCol].notNull, seenReplace != 0)))) {
      if (overrideError == '\v') {
        if (seenReplace == 0xb) {
          seenReplace = 2;
        }
      }
      else {
        seenReplace = (int)overrideError;
      }
      if ((seenReplace == 5) && (pTab->aCol[nCol].pDflt == (Expr *)0x0)) {
        seenReplace = 2;
      }
      switch(seenReplace) {
      case 2:
        sqlite3MayAbort(pParse);
      case 1:
      case 3:
        pP4 = sqlite3MPrintf(db_00,"%s.%s",pTab->zName,pTab->aCol[nCol].zName);
        sqlite3VdbeAddOp3(p,0x44,0x513,seenReplace,regNewData + 1 + nCol);
        sqlite3VdbeAppendP4(p,pP4,-7);
        sqlite3VdbeChangeP5(p,1);
        break;
      case 4:
        sqlite3VdbeAddOp2(p,0x32,regNewData + 1 + nCol,ignoreDest);
        break;
      default:
        iVar9 = sqlite3VdbeAddOp1(p,0x33,regNewData + 1 + nCol);
        sqlite3ExprCode(pParse,pTab->aCol[nCol].pDflt,regNewData + 1 + nCol);
        sqlite3VdbeJumpHere(p,iVar9);
      }
    }
  }
  if ((pTab->pCheck != (ExprList *)0x0) && ((db_00->flags & 0x200) == 0)) {
    pEVar6 = pTab->pCheck;
    pParse->iSelfTab = -(regNewData + 1);
    if (overrideError == '\v') {
      local_11c = 2;
    }
    else {
      local_11c = (uint)overrideError;
    }
    seenReplace = local_11c;
    for (nCol = 0; nCol < pEVar6->nExpr; nCol = nCol + 1) {
      pExpr_00 = pEVar6->a[nCol].pExpr;
      if ((aiChng == (int *)0x0) ||
         (iVar9 = sqlite3ExprReferencesUpdatedColumn(pExpr_00,aiChng,(uint)pkChng), iVar9 != 0)) {
        iVar9 = sqlite3VdbeMakeLabel(p);
        sqlite3ExprIfTrue(pParse,pExpr_00,iVar9,0x10);
        if (seenReplace == 4) {
          sqlite3VdbeGoto(p,ignoreDest);
        }
        else {
          pcStack_c8 = pEVar6->a[nCol].zName;
          if (pcStack_c8 == (char *)0x0) {
            pcStack_c8 = pTab->zName;
          }
          if (seenReplace == 5) {
            seenReplace = 2;
          }
          sqlite3HaltConstraint(pParse,0x113,seenReplace,pcStack_c8,'\0','\x03');
        }
        sqlite3VdbeResolveLabel(p,iVar9);
      }
    }
    pParse->iSelfTab = 0;
  }
  if (pUpsert != (Upsert *)0x0) {
    if (pUpsert->pUpsertTarget == (ExprList *)0x0) {
      overrideError = '\x04';
      pUpsert = (Upsert *)0x0;
    }
    else {
      _upsertBypass = pUpsert->pUpsertIdx;
      if (_upsertBypass != (Index *)0x0) {
        ipkBottom = sqlite3VdbeAddOp0(p,0xb);
      }
    }
  }
  if ((pkChng != '\0') && (db == (sqlite3 *)0x0)) {
    iVar9 = sqlite3VdbeMakeLabel(p);
    seenReplace = (int)pTab->keyConf;
    if (overrideError == '\v') {
      if (seenReplace == 0xb) {
        seenReplace = 2;
      }
    }
    else {
      seenReplace = (int)overrideError;
    }
    if ((pUpsert != (Upsert *)0x0) && (pUpsert->pUpsertIdx == (Index *)0x0)) {
      if (pUpsert->pUpsertSet == (ExprList *)0x0) {
        seenReplace = 4;
      }
      else {
        seenReplace = 6;
      }
    }
    if (((seenReplace == 5) && (overrideError != '\x05')) && (pTab->pIndex != (Index *)0x0)) {
      local_98 = sqlite3VdbeAddOp0(p,0xb);
      local_98 = local_98 + 1;
    }
    if (bVar14) {
      sqlite3VdbeAddOp3(p,0x35,regNewData,iVar9,regOldData);
      sqlite3VdbeChangeP5(p,0x90);
    }
    sqlite3VdbeAddOp3(p,0x1f,iDataCur,iVar9,regNewData);
    switch(seenReplace) {
    case 5:
      _regR = (Trigger *)0x0;
      if ((db_00->flags & 0x2000) != 0) {
        _regR = sqlite3TriggersExist(pParse,pTab,0x75,(ExprList *)0x0,(int *)0x0);
      }
      if ((_regR == (Trigger *)0x0) &&
         (iVar10 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0), iVar10 == 0)) {
        if (pTab->pIndex != (Index *)0x0) {
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowIndexDelete(pParse,pTab,iDataCur,iIdxCur,(int *)0x0,-1);
        }
      }
      else {
        sqlite3MultiWrite(pParse);
        sqlite3GenerateRowDelete
                  (pParse,pTab,_regR,iDataCur,iIdxCur,regNewData,1,'\0','\x05','\x01',-1);
      }
      local_78 = 1;
      break;
    case 6:
      sqlite3UpsertDoUpdate(pParse,pUpsert,pTab,(Index *)0x0,iDataCur);
    case 4:
      sqlite3VdbeGoto(p,ignoreDest);
      break;
    default:
      seenReplace = 2;
    case 1:
    case 2:
    case 3:
      sqlite3RowidConstraint(pParse,seenReplace,pTab);
    }
    sqlite3VdbeResolveLabel(p,iVar9);
    if (local_98 != 0) {
      zMsg._4_4_ = sqlite3VdbeAddOp0(p,0xb);
      sqlite3VdbeJumpHere(p,local_98 + -1);
    }
  }
  onError = 0;
  pPk = pTab->pIndex;
  do {
    if (pPk == (Index *)0x0) {
      if (local_98 != 0) {
        sqlite3VdbeGoto(p,local_98 + 1);
        sqlite3VdbeJumpHere(p,zMsg._4_4_);
      }
      *pbMayReplace = local_78;
      return;
    }
    if (aRegIdx[onError] != 0) {
      if (_upsertBypass == pPk) {
        x = ipkBottom + 1;
        ipkTop = sqlite3VdbeGoto(p,0);
        sqlite3VdbeJumpHere(p,ipkBottom);
      }
      else {
        x = sqlite3VdbeMakeLabel(p);
      }
      if ((!bVar7) && ((_upsertBypass == (Index *)0x0 || (_upsertBypass == pPk)))) {
        sqlite3TableAffinity(p,pTab,regNewData + 1);
        bVar7 = true;
      }
      iVar9 = iIdxCur + onError;
      if (pPk->pPartIdxWhere != (Expr *)0x0) {
        sqlite3VdbeAddOp2(p,0x49,0,aRegIdx[onError]);
        pParse->iSelfTab = -(regNewData + 1);
        sqlite3ExprIfFalseDup(pParse,pPk->pPartIdxWhere,x,0x10);
        pParse->iSelfTab = 0;
      }
      iVar10 = aRegIdx[onError] + 1;
      for (nCol = 0; nCol < (int)(uint)pPk->nColumn; nCol = nCol + 1) {
        iVar11 = (int)pPk->aiColumn[nCol];
        if (iVar11 == -2) {
          pParse->iSelfTab = -(regNewData + 1);
          sqlite3ExprCodeCopy(pParse,pPk->aColExpr->a[nCol].pExpr,iVar10 + nCol);
          pParse->iSelfTab = 0;
        }
        else {
          addrJump = regNewData;
          if ((iVar11 != -1) && (iVar11 != pTab->iPKey)) {
            addrJump = iVar11 + regNewData + 1;
          }
          op_00 = 0x4f;
          if (iVar11 < 0) {
            op_00 = 0x50;
          }
          sqlite3VdbeAddOp2(p,op_00,addrJump,iVar10 + nCol);
        }
      }
      sqlite3VdbeAddOp3(p,0x66,iVar10,(uint)pPk->nColumn,aRegIdx[onError]);
      if (((bVar14) && (db == (sqlite3 *)pPk)) && (pkChng == '\0')) {
        sqlite3VdbeResolveLabel(p,x);
      }
      else {
        seenReplace = (int)pPk->onError;
        if (seenReplace == 0) {
          sqlite3VdbeResolveLabel(p,x);
        }
        else {
          if (overrideError == '\v') {
            if (seenReplace == 0xb) {
              seenReplace = 2;
            }
          }
          else {
            seenReplace = (int)overrideError;
          }
          if (_upsertBypass == pPk) {
            if (pUpsert->pUpsertSet == (ExprList *)0x0) {
              seenReplace = 4;
            }
            else {
              seenReplace = 6;
            }
          }
          if (((((onError == 0) && (pPk->pNext == (Index *)0x0)) &&
               ((db == (sqlite3 *)pPk && (seenReplace == 5)))) &&
              (((db_00->flags & 0x2000) == 0 ||
               (pTVar12 = sqlite3TriggersExist(pParse,pTab,0x75,(ExprList *)0x0,(int *)0x0),
               pTVar12 == (Trigger *)0x0)))) &&
             (((db_00->flags & 0x4000) == 0 ||
              ((pTab->pFKey == (FKey *)0x0 &&
               (pFVar13 = sqlite3FkReferences(pTab), pFVar13 == (FKey *)0x0)))))) {
            sqlite3VdbeResolveLabel(p,x);
          }
          else {
            sqlite3VdbeAddOp4Int(p,0x1b,iVar9,x,iVar10,(uint)pPk->nKeyCol);
            local_12c = iVar10;
            if ((sqlite3 *)pPk != db) {
              local_12c = sqlite3GetTempRange(pParse,pUpIdx._4_4_);
            }
            if ((bVar14) || (seenReplace == 5)) {
              if ((pTab->tabFlags & 0x20) == 0) {
                sqlite3VdbeAddOp2(p,0x88,iVar9,local_12c);
                if (bVar14) {
                  sqlite3VdbeAddOp3(p,0x35,local_12c,x,regOldData);
                  sqlite3VdbeChangeP5(p,0x90);
                }
              }
              else {
                if ((sqlite3 *)pPk != db) {
                  for (nCol = 0; uVar2._0_1_ = db->enc, uVar2._1_1_ = db->autoCommit,
                      nCol < (int)(uint)uVar2; nCol = nCol + 1) {
                    iVar8 = sqlite3ColumnOfIndex
                                      (pPk,*(i16 *)((long)&db->pVdbe->db + (long)nCol * 2));
                    sqlite3VdbeAddOp3(p,0x5a,iVar9,(int)iVar8,local_12c + nCol);
                  }
                }
                if (bVar14) {
                  iVar11 = sqlite3VdbeCurrentAddr(p);
                  uVar3._0_1_ = db->enc;
                  uVar3._1_1_ = db->autoCommit;
                  regCmp = iVar11 + (uint)uVar3;
                  p4._4_4_ = 0x34;
                  local_130 = iVar10;
                  if ((*(ushort *)&pPk->field_0x63 & 3) != 2) {
                    local_130 = local_12c;
                  }
                  for (nCol = 0; uVar4._0_1_ = db->enc, uVar4._1_1_ = db->autoCommit,
                      nCol < (int)(uint)uVar4; nCol = nCol + 1) {
                    zP4 = sqlite3LocateCollSeq(pParse,*(char **)(db->szMmap + (long)nCol * 8));
                    uVar5._0_1_ = db->enc;
                    uVar5._1_1_ = db->autoCommit;
                    if (nCol == uVar5 - 1) {
                      regCmp = x;
                      p4._4_4_ = 0x35;
                    }
                    sqlite3VdbeAddOp4(p,p4._4_4_,
                                      regOldData + 1 +
                                      (int)*(short *)((long)&db->pVdbe->db + (long)nCol * 2),regCmp,
                                      local_130 + nCol,(char *)zP4,-2);
                    sqlite3VdbeChangeP5(p,0x90);
                  }
                }
              }
            }
            if (seenReplace - 1U < 3) {
              sqlite3UniqueConstraint(pParse,seenReplace,pPk);
            }
            else {
              if (seenReplace != 4) {
                if (seenReplace != 6) {
                  local_110 = (Trigger *)0x0;
                  if ((db_00->flags & 0x2000) != 0) {
                    local_110 = sqlite3TriggersExist(pParse,pTab,0x75,(ExprList *)0x0,(int *)0x0);
                  }
                  if ((local_110 != (Trigger *)0x0) ||
                     (iVar11 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0), iVar11 != 0)) {
                    sqlite3MultiWrite(pParse);
                  }
                  sqlite3GenerateRowDelete
                            (pParse,pTab,local_110,iDataCur,iIdxCur,local_12c,(i16)pUpIdx._4_4_,'\0'
                             ,'\x05',(sqlite3 *)pPk == db,iVar9);
                  local_78 = 1;
                  goto LAB_001a1dc1;
                }
                sqlite3UpsertDoUpdate(pParse,pUpsert,pTab,pPk,iIdxCur + onError);
              }
              sqlite3VdbeGoto(p,ignoreDest);
            }
LAB_001a1dc1:
            if (_upsertBypass == pPk) {
              sqlite3VdbeGoto(p,ipkBottom + 1);
              sqlite3VdbeJumpHere(p,ipkTop);
            }
            else {
              sqlite3VdbeResolveLabel(p,x);
            }
            if (local_12c != iVar10) {
              sqlite3ReleaseTempRange(pParse,local_12c,pUpIdx._4_4_);
            }
          }
        }
      }
    }
    pPk = pPk->pNext;
    onError = onError + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateConstraintChecks(
  Parse *pParse,       /* The parser context */
  Table *pTab,         /* The table being inserted or updated */
  int *aRegIdx,        /* Use register aRegIdx[i] for index i.  0 for unused */
  int iDataCur,        /* Canonical data cursor (main table or PK index) */
  int iIdxCur,         /* First index cursor */
  int regNewData,      /* First register in a range holding values to insert */
  int regOldData,      /* Previous content.  0 for INSERTs */
  u8 pkChng,           /* Non-zero if the rowid or PRIMARY KEY changed */
  u8 overrideError,    /* Override onError to this if not OE_Default */
  int ignoreDest,      /* Jump to this label on an OE_Ignore resolution */
  int *pbMayReplace,   /* OUT: Set to true if constraint may cause a replace */
  int *aiChng,         /* column i is unchanged if aiChng[i]<0 */
  Upsert *pUpsert      /* ON CONFLICT clauses, if any.  NULL otherwise */
){
  Vdbe *v;             /* VDBE under constrution */
  Index *pIdx;         /* Pointer to one of the indices */
  Index *pPk = 0;      /* The PRIMARY KEY index */
  sqlite3 *db;         /* Database connection */
  int i;               /* loop counter */
  int ix;              /* Index loop counter */
  int nCol;            /* Number of columns */
  int onError;         /* Conflict resolution strategy */
  int addr1;           /* Address of jump instruction */
  int seenReplace = 0; /* True if REPLACE is used to resolve INT PK conflict */
  int nPkField;        /* Number of fields in PRIMARY KEY. 1 for ROWID tables */
  Index *pUpIdx = 0;   /* Index to which to apply the upsert */
  u8 isUpdate;         /* True if this is an UPDATE operation */
  u8 bAffinityDone = 0;  /* True if the OP_Affinity operation has been run */
  int upsertBypass = 0;  /* Address of Goto to bypass upsert subroutine */
  int upsertJump = 0;    /* Address of Goto that jumps into upsert subroutine */
  int ipkTop = 0;        /* Top of the IPK uniqueness check */
  int ipkBottom = 0;     /* OP_Goto at the end of the IPK uniqueness check */

  isUpdate = regOldData!=0;
  db = pParse->db;
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  nCol = pTab->nCol;
  
  /* pPk is the PRIMARY KEY index for WITHOUT ROWID tables and NULL for
  ** normal rowid tables.  nPkField is the number of key fields in the 
  ** pPk index or 1 for a rowid table.  In other words, nPkField is the
  ** number of fields in the true primary key of the table. */
  if( HasRowid(pTab) ){
    pPk = 0;
    nPkField = 1;
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    nPkField = pPk->nKeyCol;
  }

  /* Record that this module has started */
  VdbeModuleComment((v, "BEGIN: GenCnstCks(%d,%d,%d,%d,%d)",
                     iDataCur, iIdxCur, regNewData, regOldData, pkChng));

  /* Test all NOT NULL constraints.
  */
  for(i=0; i<nCol; i++){
    if( i==pTab->iPKey ){
      continue;        /* ROWID is never NULL */
    }
    if( aiChng && aiChng[i]<0 ){
      /* Don't bother checking for NOT NULL on columns that do not change */
      continue;
    }
    onError = pTab->aCol[i].notNull;
    if( onError==OE_None ) continue;  /* This column is allowed to be NULL */
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    if( onError==OE_Replace && pTab->aCol[i].pDflt==0 ){
      onError = OE_Abort;
    }
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Abort:
        sqlite3MayAbort(pParse);
        /* Fall through */
      case OE_Rollback:
      case OE_Fail: {
        char *zMsg = sqlite3MPrintf(db, "%s.%s", pTab->zName,
                                    pTab->aCol[i].zName);
        sqlite3VdbeAddOp3(v, OP_HaltIfNull, SQLITE_CONSTRAINT_NOTNULL, onError,
                          regNewData+1+i);
        sqlite3VdbeAppendP4(v, zMsg, P4_DYNAMIC);
        sqlite3VdbeChangeP5(v, P5_ConstraintNotNull);
        VdbeCoverage(v);
        break;
      }
      case OE_Ignore: {
        sqlite3VdbeAddOp2(v, OP_IsNull, regNewData+1+i, ignoreDest);
        VdbeCoverage(v);
        break;
      }
      default: {
        assert( onError==OE_Replace );
        addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, regNewData+1+i);
           VdbeCoverage(v);
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regNewData+1+i);
        sqlite3VdbeJumpHere(v, addr1);
        break;
      }
    }
  }

  /* Test all CHECK constraints
  */
#ifndef SQLITE_OMIT_CHECK
  if( pTab->pCheck && (db->flags & SQLITE_IgnoreChecks)==0 ){
    ExprList *pCheck = pTab->pCheck;
    pParse->iSelfTab = -(regNewData+1);
    onError = overrideError!=OE_Default ? overrideError : OE_Abort;
    for(i=0; i<pCheck->nExpr; i++){
      int allOk;
      Expr *pExpr = pCheck->a[i].pExpr;
      if( aiChng
       && !sqlite3ExprReferencesUpdatedColumn(pExpr, aiChng, pkChng)
      ){
        /* The check constraints do not reference any of the columns being
        ** updated so there is no point it verifying the check constraint */
        continue;
      }
      allOk = sqlite3VdbeMakeLabel(v);
      sqlite3VdbeVerifyAbortable(v, onError);
      sqlite3ExprIfTrue(pParse, pExpr, allOk, SQLITE_JUMPIFNULL);
      if( onError==OE_Ignore ){
        sqlite3VdbeGoto(v, ignoreDest);
      }else{
        char *zName = pCheck->a[i].zName;
        if( zName==0 ) zName = pTab->zName;
        if( onError==OE_Replace ) onError = OE_Abort; /* IMP: R-15569-63625 */
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_CHECK,
                              onError, zName, P4_TRANSIENT,
                              P5_ConstraintCheck);
      }
      sqlite3VdbeResolveLabel(v, allOk);
    }
    pParse->iSelfTab = 0;
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* UNIQUE and PRIMARY KEY constraints should be handled in the following
  ** order:
  **
  **   (1)  OE_Update
  **   (2)  OE_Abort, OE_Fail, OE_Rollback, OE_Ignore
  **   (3)  OE_Replace
  **
  ** OE_Fail and OE_Ignore must happen before any changes are made.
  ** OE_Update guarantees that only a single row will change, so it
  ** must happen before OE_Replace.  Technically, OE_Abort and OE_Rollback
  ** could happen in any order, but they are grouped up front for
  ** convenience.
  **
  ** 2018-08-14: Ticket https://www.sqlite.org/src/info/908f001483982c43
  ** The order of constraints used to have OE_Update as (2) and OE_Abort
  ** and so forth as (1). But apparently PostgreSQL checks the OE_Update
  ** constraint before any others, so it had to be moved.
  **
  ** Constraint checking code is generated in this order:
  **   (A)  The rowid constraint
  **   (B)  Unique index constraints that do not have OE_Replace as their
  **        default conflict resolution strategy
  **   (C)  Unique index that do use OE_Replace by default.
  **
  ** The ordering of (2) and (3) is accomplished by making sure the linked
  ** list of indexes attached to a table puts all OE_Replace indexes last
  ** in the list.  See sqlite3CreateIndex() for where that happens.
  */

  if( pUpsert ){
    if( pUpsert->pUpsertTarget==0 ){
      /* An ON CONFLICT DO NOTHING clause, without a constraint-target.
      ** Make all unique constraint resolution be OE_Ignore */
      assert( pUpsert->pUpsertSet==0 );
      overrideError = OE_Ignore;
      pUpsert = 0;
    }else if( (pUpIdx = pUpsert->pUpsertIdx)!=0 ){
      /* If the constraint-target uniqueness check must be run first.
      ** Jump to that uniqueness check now */
      upsertJump = sqlite3VdbeAddOp0(v, OP_Goto);
      VdbeComment((v, "UPSERT constraint goes first"));
    }
  }

  /* If rowid is changing, make sure the new rowid does not previously
  ** exist in the table.
  */
  if( pkChng && pPk==0 ){
    int addrRowidOk = sqlite3VdbeMakeLabel(v);

    /* Figure out what action to take in case of a rowid collision */
    onError = pTab->keyConf;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }

    /* figure out whether or not upsert applies in this case */
    if( pUpsert && pUpsert->pUpsertIdx==0 ){
      if( pUpsert->pUpsertSet==0 ){
        onError = OE_Ignore;  /* DO NOTHING is the same as INSERT OR IGNORE */
      }else{
        onError = OE_Update;  /* DO UPDATE */
      }
    }

    /* If the response to a rowid conflict is REPLACE but the response
    ** to some other UNIQUE constraint is FAIL or IGNORE, then we need
    ** to defer the running of the rowid conflict checking until after
    ** the UNIQUE constraints have run.
    */
    if( onError==OE_Replace      /* IPK rule is REPLACE */
     && onError!=overrideError   /* Rules for other contraints are different */
     && pTab->pIndex             /* There exist other constraints */
    ){
      ipkTop = sqlite3VdbeAddOp0(v, OP_Goto)+1;
      VdbeComment((v, "defer IPK REPLACE until last"));
    }

    if( isUpdate ){
      /* pkChng!=0 does not mean that the rowid has changed, only that
      ** it might have changed.  Skip the conflict logic below if the rowid
      ** is unchanged. */
      sqlite3VdbeAddOp3(v, OP_Eq, regNewData, addrRowidOk, regOldData);
      sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
      VdbeCoverage(v);
    }

    /* Check to see if the new rowid already exists in the table.  Skip
    ** the following conflict logic if it does not. */
    VdbeNoopComment((v, "uniqueness check for ROWID"));
    sqlite3VdbeVerifyAbortable(v, onError);
    sqlite3VdbeAddOp3(v, OP_NotExists, iDataCur, addrRowidOk, regNewData);
    VdbeCoverage(v);

    switch( onError ){
      default: {
        onError = OE_Abort;
        /* Fall thru into the next case */
      }
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        testcase( onError==OE_Rollback );
        testcase( onError==OE_Abort );
        testcase( onError==OE_Fail );
        sqlite3RowidConstraint(pParse, onError, pTab);
        break;
      }
      case OE_Replace: {
        /* If there are DELETE triggers on this table and the
        ** recursive-triggers flag is set, call GenerateRowDelete() to
        ** remove the conflicting row from the table. This will fire
        ** the triggers and remove both the table and index b-tree entries.
        **
        ** Otherwise, if there are no triggers or the recursive-triggers
        ** flag is not set, but the table has one or more indexes, call 
        ** GenerateRowIndexDelete(). This removes the index b-tree entries 
        ** only. The table b-tree entry will be replaced by the new entry 
        ** when it is inserted.  
        **
        ** If either GenerateRowDelete() or GenerateRowIndexDelete() is called,
        ** also invoke MultiWrite() to indicate that this VDBE may require
        ** statement rollback (if the statement is aborted after the delete
        ** takes place). Earlier versions called sqlite3MultiWrite() regardless,
        ** but being more selective here allows statements like:
        **
        **   REPLACE INTO t(rowid) VALUES($newrowid)
        **
        ** to run without a statement journal if there are no indexes on the
        ** table.
        */
        Trigger *pTrigger = 0;
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        if( pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0) ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
                                   regNewData, 1, 0, OE_Replace, 1, -1);
        }else{
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
          assert( HasRowid(pTab) );
          /* This OP_Delete opcode fires the pre-update-hook only. It does
          ** not modify the b-tree. It is more efficient to let the coming
          ** OP_Insert replace the existing entry than it is to delete the
          ** existing entry and then insert a new one. */
          sqlite3VdbeAddOp2(v, OP_Delete, iDataCur, OPFLAG_ISNOOP);
          sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
#endif /* SQLITE_ENABLE_PREUPDATE_HOOK */
          if( pTab->pIndex ){
            sqlite3MultiWrite(pParse);
            sqlite3GenerateRowIndexDelete(pParse, pTab, iDataCur, iIdxCur,0,-1);
          }
        }
        seenReplace = 1;
        break;
      }
#ifndef SQLITE_OMIT_UPSERT
      case OE_Update: {
        sqlite3UpsertDoUpdate(pParse, pUpsert, pTab, 0, iDataCur);
        /* Fall through */
      }
#endif
      case OE_Ignore: {
        testcase( onError==OE_Ignore );
        sqlite3VdbeGoto(v, ignoreDest);
        break;
      }
    }
    sqlite3VdbeResolveLabel(v, addrRowidOk);
    if( ipkTop ){
      ipkBottom = sqlite3VdbeAddOp0(v, OP_Goto);
      sqlite3VdbeJumpHere(v, ipkTop-1);
    }
  }

  /* Test all UNIQUE constraints by creating entries for each UNIQUE
  ** index and making sure that duplicate entries do not already exist.
  ** Compute the revised record entries for indices as we go.
  **
  ** This loop also handles the case of the PRIMARY KEY index for a
  ** WITHOUT ROWID table.
  */
  for(ix=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, ix++){
    int regIdx;          /* Range of registers hold conent for pIdx */
    int regR;            /* Range of registers holding conflicting PK */
    int iThisCur;        /* Cursor for this UNIQUE index */
    int addrUniqueOk;    /* Jump here if the UNIQUE constraint is satisfied */

    if( aRegIdx[ix]==0 ) continue;  /* Skip indices that do not change */
    if( pUpIdx==pIdx ){
      addrUniqueOk = upsertJump+1;
      upsertBypass = sqlite3VdbeGoto(v, 0);
      VdbeComment((v, "Skip upsert subroutine"));
      sqlite3VdbeJumpHere(v, upsertJump);
    }else{
      addrUniqueOk = sqlite3VdbeMakeLabel(v);
    }
    if( bAffinityDone==0 && (pUpIdx==0 || pUpIdx==pIdx) ){
      sqlite3TableAffinity(v, pTab, regNewData+1);
      bAffinityDone = 1;
    }
    VdbeNoopComment((v, "uniqueness check for %s", pIdx->zName));
    iThisCur = iIdxCur+ix;


    /* Skip partial indices for which the WHERE clause is not true */
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, aRegIdx[ix]);
      pParse->iSelfTab = -(regNewData+1);
      sqlite3ExprIfFalseDup(pParse, pIdx->pPartIdxWhere, addrUniqueOk,
                            SQLITE_JUMPIFNULL);
      pParse->iSelfTab = 0;
    }

    /* Create a record for this index entry as it should appear after
    ** the insert or update.  Store that record in the aRegIdx[ix] register
    */
    regIdx = aRegIdx[ix]+1;
    for(i=0; i<pIdx->nColumn; i++){
      int iField = pIdx->aiColumn[i];
      int x;
      if( iField==XN_EXPR ){
        pParse->iSelfTab = -(regNewData+1);
        sqlite3ExprCodeCopy(pParse, pIdx->aColExpr->a[i].pExpr, regIdx+i);
        pParse->iSelfTab = 0;
        VdbeComment((v, "%s column %d", pIdx->zName, i));
      }else{
        if( iField==XN_ROWID || iField==pTab->iPKey ){
          x = regNewData;
        }else{
          x = iField + regNewData + 1;
        }
        sqlite3VdbeAddOp2(v, iField<0 ? OP_IntCopy : OP_SCopy, x, regIdx+i);
        VdbeComment((v, "%s", iField<0 ? "rowid" : pTab->aCol[iField].zName));
      }
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regIdx, pIdx->nColumn, aRegIdx[ix]);
    VdbeComment((v, "for %s", pIdx->zName));
#ifdef SQLITE_ENABLE_NULL_TRIM
    if( pIdx->idxType==2 ) sqlite3SetMakeRecordP5(v, pIdx->pTable);
#endif

    /* In an UPDATE operation, if this index is the PRIMARY KEY index 
    ** of a WITHOUT ROWID table and there has been no change the
    ** primary key, then no collision is possible.  The collision detection
    ** logic below can all be skipped. */
    if( isUpdate && pPk==pIdx && pkChng==0 ){
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
      continue;
    }

    /* Find out what action to take in case there is a uniqueness conflict */
    onError = pIdx->onError;
    if( onError==OE_None ){ 
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
      continue;  /* pIdx is not a UNIQUE index */
    }
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }

    /* Figure out if the upsert clause applies to this index */
    if( pUpIdx==pIdx ){
      if( pUpsert->pUpsertSet==0 ){
        onError = OE_Ignore;  /* DO NOTHING is the same as INSERT OR IGNORE */
      }else{
        onError = OE_Update;  /* DO UPDATE */
      }
    }

    /* Collision detection may be omitted if all of the following are true:
    **   (1) The conflict resolution algorithm is REPLACE
    **   (2) The table is a WITHOUT ROWID table
    **   (3) There are no secondary indexes on the table
    **   (4) No delete triggers need to be fired if there is a conflict
    **   (5) No FK constraint counters need to be updated if a conflict occurs.
    */ 
    if( (ix==0 && pIdx->pNext==0)                   /* Condition 3 */
     && pPk==pIdx                                   /* Condition 2 */
     && onError==OE_Replace                         /* Condition 1 */
     && ( 0==(db->flags&SQLITE_RecTriggers) ||      /* Condition 4 */
          0==sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0))
     && ( 0==(db->flags&SQLITE_ForeignKeys) ||      /* Condition 5 */
         (0==pTab->pFKey && 0==sqlite3FkReferences(pTab)))
    ){
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
      continue;
    }

    /* Check to see if the new index entry will be unique */
    sqlite3VdbeVerifyAbortable(v, onError);
    sqlite3VdbeAddOp4Int(v, OP_NoConflict, iThisCur, addrUniqueOk,
                         regIdx, pIdx->nKeyCol); VdbeCoverage(v);

    /* Generate code to handle collisions */
    regR = (pIdx==pPk) ? regIdx : sqlite3GetTempRange(pParse, nPkField);
    if( isUpdate || onError==OE_Replace ){
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp2(v, OP_IdxRowid, iThisCur, regR);
        /* Conflict only if the rowid of the existing index entry
        ** is different from old-rowid */
        if( isUpdate ){
          sqlite3VdbeAddOp3(v, OP_Eq, regR, addrUniqueOk, regOldData);
          sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
          VdbeCoverage(v);
        }
      }else{
        int x;
        /* Extract the PRIMARY KEY from the end of the index entry and
        ** store it in registers regR..regR+nPk-1 */
        if( pIdx!=pPk ){
          for(i=0; i<pPk->nKeyCol; i++){
            assert( pPk->aiColumn[i]>=0 );
            x = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[i]);
            sqlite3VdbeAddOp3(v, OP_Column, iThisCur, x, regR+i);
            VdbeComment((v, "%s.%s", pTab->zName,
                         pTab->aCol[pPk->aiColumn[i]].zName));
          }
        }
        if( isUpdate ){
          /* If currently processing the PRIMARY KEY of a WITHOUT ROWID 
          ** table, only conflict if the new PRIMARY KEY values are actually
          ** different from the old.
          **
          ** For a UNIQUE index, only conflict if the PRIMARY KEY values
          ** of the matched index row are different from the original PRIMARY
          ** KEY values of this row before the update.  */
          int addrJump = sqlite3VdbeCurrentAddr(v)+pPk->nKeyCol;
          int op = OP_Ne;
          int regCmp = (IsPrimaryKeyIndex(pIdx) ? regIdx : regR);
  
          for(i=0; i<pPk->nKeyCol; i++){
            char *p4 = (char*)sqlite3LocateCollSeq(pParse, pPk->azColl[i]);
            x = pPk->aiColumn[i];
            assert( x>=0 );
            if( i==(pPk->nKeyCol-1) ){
              addrJump = addrUniqueOk;
              op = OP_Eq;
            }
            sqlite3VdbeAddOp4(v, op, 
                regOldData+1+x, addrJump, regCmp+i, p4, P4_COLLSEQ
            );
            sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
            VdbeCoverageIf(v, op==OP_Eq);
            VdbeCoverageIf(v, op==OP_Ne);
          }
        }
      }
    }

    /* Generate code that executes if the new index entry is not unique */
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace || onError==OE_Update );
    switch( onError ){
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        testcase( onError==OE_Rollback );
        testcase( onError==OE_Abort );
        testcase( onError==OE_Fail );
        sqlite3UniqueConstraint(pParse, onError, pIdx);
        break;
      }
#ifndef SQLITE_OMIT_UPSERT
      case OE_Update: {
        sqlite3UpsertDoUpdate(pParse, pUpsert, pTab, pIdx, iIdxCur+ix);
        /* Fall through */
      }
#endif
      case OE_Ignore: {
        testcase( onError==OE_Ignore );
        sqlite3VdbeGoto(v, ignoreDest);
        break;
      }
      default: {
        Trigger *pTrigger = 0;
        assert( onError==OE_Replace );
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        if( pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0) ){
          sqlite3MultiWrite(pParse);
        }
        sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
            regR, nPkField, 0, OE_Replace,
            (pIdx==pPk ? ONEPASS_SINGLE : ONEPASS_OFF), iThisCur);
        seenReplace = 1;
        break;
      }
    }
    if( pUpIdx==pIdx ){
      sqlite3VdbeGoto(v, upsertJump+1);
      sqlite3VdbeJumpHere(v, upsertBypass);
    }else{
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
    }
    if( regR!=regIdx ) sqlite3ReleaseTempRange(pParse, regR, nPkField);
  }

  /* If the IPK constraint is a REPLACE, run it last */
  if( ipkTop ){
    sqlite3VdbeGoto(v, ipkTop+1);
    VdbeComment((v, "Do IPK REPLACE"));
    sqlite3VdbeJumpHere(v, ipkBottom);
  }

  *pbMayReplace = seenReplace;
  VdbeModuleComment((v, "END: GenCnstCks(%d)", seenReplace));
}